

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

complex<double> __thiscall
TPZFMatrix<std::complex<double>_>::operator()
          (TPZFMatrix<std::complex<double>_> *this,int64_t row,int64_t col)

{
  int64_t iVar1;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  complex<double> cVar2;
  char *in_stack_00000178;
  char *in_stack_00000180;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  if ((in_RSI < iVar1) && (-1 < in_RSI)) {
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    if ((in_RDX < iVar1) && (-1 < in_RDX)) goto LAB_0123b41c;
  }
  Error(in_stack_00000180,in_stack_00000178);
  pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
LAB_0123b41c:
  cVar2._M_value._0_8_ = in_RSI * 0x10;
  cVar2._M_value._8_8_ = in_RDI->fRow;
  return (complex<double>)cVar2._M_value;
}

Assistant:

inline TVar TPZFMatrix<TVar>::operator()( const int64_t row, const int64_t col) const {
#ifndef PZNODEBUG
    if(row >=  this->Rows() || row<0 || col >=  this->Cols() || col<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+col*this->fRow+row);
}